

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_lazy_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableLazyMessageFieldGenerator::GenerateBuildingCode
          (ImmutableLazyMessageFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableLazyMessageFieldGenerator *this_local;
  
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "if ($get_has_field_bit_from_local$) {\n  $set_has_field_bit_to_local$;\n}\n");
  io::Printer::Print(printer,&(this->super_ImmutableMessageFieldGenerator).variables_,
                     "result.$name$_.set(\n    $name$_);\n");
  return;
}

Assistant:

void ImmutableLazyMessageFieldGenerator::
GenerateBuildingCode(io::Printer* printer) const {
  printer->Print(variables_,
      "if ($get_has_field_bit_from_local$) {\n"
      "  $set_has_field_bit_to_local$;\n"
      "}\n");

  printer->Print(variables_,
      "result.$name$_.set(\n"
      "    $name$_);\n");
}